

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall QGraphicsAnchorLayoutPrivate::createLayoutEdges(QGraphicsAnchorLayoutPrivate *this)

{
  QGraphicsAnchorLayoutPrivate *firstItem;
  void *pvVar1;
  AnchorData *this_00;
  AnchorVertex **ppAVar2;
  AnchorVertex *pAVar3;
  QGraphicsLayoutItem *item;
  QGraphicsAnchorLayoutPrivate *pQVar4;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  AnchorData *data;
  QGraphicsLayoutItem *layout;
  QGraphicsAnchorLayout *q;
  AnchorData *in_stack_ffffffffffffffb0;
  QGraphicsLayoutItem *in_stack_ffffffffffffffc0;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffffc8;
  QGraphicsLayoutItem *in_stack_ffffffffffffffd8;
  AnchorPoint AVar5;
  Orientation o;
  QGraphicsLayoutItem *pQVar6;
  
  firstItem = (QGraphicsAnchorLayoutPrivate *)q_func(in_RDI);
  AVar5 = (AnchorPoint)((ulong)in_RDI >> 0x20);
  pQVar4 = firstItem;
  pvVar1 = operator_new(0x80);
  QtGraphicsAnchorLayout::AnchorData::AnchorData(in_stack_ffffffffffffffb0);
  o = (Orientation)((ulong)pvVar1 >> 0x20);
  addAnchor_helper(pQVar4,(QGraphicsLayoutItem *)firstItem,o,in_stack_ffffffffffffffd8,AVar5,
                   (AnchorData *)in_stack_ffffffffffffffc8);
  *(undefined8 *)((long)pvVar1 + 0x38) = 0x416fffffe0000000;
  this_00 = (AnchorData *)
            internalVertex(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           (AnchorPoint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)this_00,o);
  *ppAVar2 = (AnchorVertex *)this_00;
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)this_00,o);
  *ppAVar2 = (AnchorVertex *)0x0;
  pAVar3 = internalVertex(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                          (AnchorPoint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)this_00,o);
  *ppAVar2 = pAVar3;
  item = (QGraphicsLayoutItem *)operator_new(0x80);
  QtGraphicsAnchorLayout::AnchorData::AnchorData(this_00);
  pQVar6 = item;
  addAnchor_helper(pQVar4,(QGraphicsLayoutItem *)firstItem,(AnchorPoint)((ulong)item >> 0x20),
                   in_stack_ffffffffffffffd8,AVar5,(AnchorData *)in_stack_ffffffffffffffc8);
  pQVar6[3].d_ptr.d = (QGraphicsLayoutItemPrivate *)0x416fffffe0000000;
  AVar5 = (AnchorPoint)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  pQVar4 = (QGraphicsAnchorLayoutPrivate *)internalVertex(in_stack_ffffffffffffffc8,item,AVar5);
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)this_00,o);
  *ppAVar2 = (AnchorVertex *)pQVar4;
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)this_00,o);
  *ppAVar2 = (AnchorVertex *)0x0;
  pAVar3 = internalVertex(pQVar4,item,AVar5);
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)this_00,o);
  *ppAVar2 = pAVar3;
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::createLayoutEdges()
{
    Q_Q(QGraphicsAnchorLayout);
    QGraphicsLayoutItem *layout = q;

    // Horizontal
    AnchorData *data = new AnchorData;
    addAnchor_helper(layout, Qt::AnchorLeft, layout,
                     Qt::AnchorRight, data);
    data->maxSize = QWIDGETSIZE_MAX;

    // Save a reference to layout vertices
    layoutFirstVertex[Qt::Horizontal] = internalVertex(layout, Qt::AnchorLeft);
    layoutCentralVertex[Qt::Horizontal] = nullptr;
    layoutLastVertex[Qt::Horizontal] = internalVertex(layout, Qt::AnchorRight);

    // Vertical
    data = new AnchorData;
    addAnchor_helper(layout, Qt::AnchorTop, layout,
                     Qt::AnchorBottom, data);
    data->maxSize = QWIDGETSIZE_MAX;

    // Save a reference to layout vertices
    layoutFirstVertex[Qt::Vertical] = internalVertex(layout, Qt::AnchorTop);
    layoutCentralVertex[Qt::Vertical] = nullptr;
    layoutLastVertex[Qt::Vertical] = internalVertex(layout, Qt::AnchorBottom);
}